

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)

{
  list_elem *plVar1;
  list_elem *__ptr;
  fdb_status fVar2;
  list_elem *plVar3;
  list_elem **__ptr_00;
  
  pthread_spin_lock(&root_handle->fhandle->lock);
  plVar1 = root_handle->fhandle->handles->head;
  while (fVar2 = FDB_RESULT_SUCCESS, plVar1 != (list_elem *)0x0) {
    plVar3 = list_remove(root_handle->fhandle->handles,plVar1);
    fVar2 = _fdb_close((fdb_kvs_handle *)plVar1[-1].next);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    __ptr_00 = &plVar1[-1].next;
    plVar1 = *__ptr_00;
    __ptr = plVar1[1].next;
    if (__ptr != (list_elem *)0x0) {
      free(__ptr);
      plVar1[1].next = (list_elem *)0x0;
    }
    free(*__ptr_00);
    free(__ptr_00);
    plVar1 = plVar3;
  }
  pthread_spin_unlock(&root_handle->fhandle->lock);
  return fVar2;
}

Assistant:

fdb_status fdb_kvs_close_all(fdb_kvs_handle *root_handle)
{
    fdb_status fs;
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&root_handle->fhandle->lock);
    e = list_begin(root_handle->fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_remove(root_handle->fhandle->handles, &node->le);
        fs = _fdb_close(node->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            spin_unlock(&root_handle->fhandle->lock);
            return fs;
        }
        fdb_kvs_info_free(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&root_handle->fhandle->lock);

    return FDB_RESULT_SUCCESS;
}